

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.h
# Opt level: O2

void __thiscall hanabi_learning_env::HanabiState::HanabiState(HanabiState *this,HanabiState *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  this->parent_game_ = state->parent_game_;
  HanabiDeck::HanabiDeck(&this->deck_,&state->deck_);
  std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
  vector(&this->discard_pile_,&state->discard_pile_);
  std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>::
  vector(&this->hands_,&state->hands_);
  std::
  vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  ::vector(&this->move_history_,&state->move_history_);
  iVar1 = state->next_non_chance_player_;
  iVar2 = state->information_tokens_;
  iVar3 = state->life_tokens_;
  this->cur_player_ = state->cur_player_;
  this->next_non_chance_player_ = iVar1;
  this->information_tokens_ = iVar2;
  this->life_tokens_ = iVar3;
  std::vector<int,_std::allocator<int>_>::vector(&this->fireworks_,&state->fireworks_);
  this->turns_to_play_ = state->turns_to_play_;
  return;
}

Assistant:

HanabiState(const HanabiState& state) = default;